

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::
basic_csv_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_next(basic_csv_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
            *this,basic_json_visitor<char> *visitor,error_code *ec)

{
  size_t *psVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *data;
  char *pcVar5;
  type tVar6;
  
  (this->parser_).more_ = true;
  do {
    if ((this->parser_).input_ptr_ == (this->parser_).input_end_) {
      pcVar4 = (this->source_).source_.current_.p_;
      if (pcVar4 == (this->source_).source_.end_.p_) {
LAB_0017429d:
        pcVar5 = (char *)0x0;
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar2 = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar5 = (char *)(this->source_).source_.buffer_length_;
        data = pcVar2;
        if (pcVar5 == (char *)0x0) {
          pcVar3 = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pcVar5 = pcVar2;
          if (pcVar3 != pcVar2 && -1 < (long)pcVar3 - (long)pcVar2) {
            do {
              if (pcVar4 == (this->source_).source_.end_.p_) break;
              *pcVar5 = *pcVar4;
              pcVar5 = pcVar5 + 1;
              pcVar4 = (this->source_).source_.current_.p_ + 1;
              (this->source_).source_.current_.p_ = pcVar4;
            } while (pcVar5 < pcVar3);
            data = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          }
          pcVar5 = pcVar5 + -(long)pcVar2;
          psVar1 = &(this->source_).source_.position_;
          *psVar1 = (size_t)(pcVar5 + *psVar1);
        }
        (this->source_).source_.buffer_length_ = 0;
        pcVar4 = data;
        if ((pcVar5 != (char *)0x0) && ((this->source_).bof_ != false)) {
          tVar6 = unicode_traits::detect_encoding_from_bom<char>(data,(size_t)pcVar5);
          pcVar4 = tVar6.ptr;
          if (utf8 < tVar6.encoding) {
            std::error_code::operator=(ec,illegal_unicode_character);
            goto LAB_0017429d;
          }
          pcVar5 = data + ((long)pcVar5 - (long)pcVar4);
          (this->source_).bof_ = false;
        }
      }
      if (ec->_M_value != 0) {
        return;
      }
      if (pcVar5 != (char *)0x0) {
        (this->parser_).begin_input_ = pcVar4;
        (this->parser_).input_end_ = pcVar4 + (long)pcVar5;
        (this->parser_).input_ptr_ = pcVar4;
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some(&this->parser_,visitor,ec);
    if (ec->_M_value != 0) {
      return;
    }
    if (((this->parser_).more_ & 1U) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                }
            }
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }
    }